

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

color * __thiscall
camera::ray_color(color *__return_storage_ptr__,camera *this,ray *r,int depth,hittable *world,
                 hittable *lights)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  char cVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  color sample_color;
  color color_from_emission;
  scatter_record srec;
  ray scattered;
  hit_record rec;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  color local_1e8;
  double local_1c8;
  double local_1c0;
  hittable *local_1b8;
  long *local_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  undefined **local_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  long *plStack_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  double local_178;
  double dStack_170;
  double local_168;
  double local_158;
  double dStack_150;
  double local_148;
  long *plStack_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  char local_130;
  ray local_128;
  undefined8 local_e8;
  ray local_d8;
  _func_int **local_98;
  double dStack_90;
  _func_int **local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  undefined4 local_50;
  undefined4 local_48;
  
  if (depth < 1) {
    __return_storage_ptr__->e[0] = 0.0;
    __return_storage_ptr__->e[1] = 0.0;
    __return_storage_ptr__->e[2] = 0.0;
  }
  else {
    local_68 = (long *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = (_func_int **)0x0;
    uStack_80 = 0;
    local_98 = (_func_int **)0x0;
    dStack_90 = 0.0;
    iVar5 = (*world->_vptr_hittable[2])(0xd2f1a9fc,0,world,r);
    if ((char)iVar5 == '\0') {
      __return_storage_ptr__->e[2] = (this->background).e[2];
      dVar3 = (this->background).e[1];
      __return_storage_ptr__->e[0] = (this->background).e[0];
      __return_storage_ptr__->e[1] = dVar3;
    }
    else {
      local_128.dir.e[1] = 0.0;
      local_128.dir.e[2] = 0.0;
      local_128.orig.e[2] = 0.0;
      local_128.dir.e[0] = 0.0;
      local_128.orig.e[0] = 0.0;
      local_128.orig.e[1] = 0.0;
      local_158 = 0.0;
      dStack_150 = 0.0;
      local_148 = 0.0;
      plStack_140 = (long *)0x0;
      local_138 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (**(code **)(*local_68 + 0x10))(local_50,local_48,&local_178,local_68,r,&local_98,&local_98);
      cVar4 = (**(code **)(*local_68 + 0x18))(local_68,r,&local_98,&local_158);
      if (cVar4 == '\0') {
        __return_storage_ptr__->e[2] = local_168;
        __return_storage_ptr__->e[0] = local_178;
        __return_storage_ptr__->e[1] = dStack_170;
      }
      else if (local_130 == '\x01') {
        ray_color(&local_d8.orig,this,&local_128,depth + -1,world,lights);
        auVar1._8_4_ = SUB84(dStack_150 * local_d8.orig.e[1],0);
        auVar1._0_8_ = local_158 * local_d8.orig.e[0];
        auVar1._12_4_ = (int)((ulong)(dStack_150 * local_d8.orig.e[1]) >> 0x20);
        *(undefined1 (*) [16])__return_storage_ptr__->e = auVar1;
        __return_storage_ptr__->e[2] = local_148 * local_d8.orig.e[2];
      }
      else {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
        this_00->_M_use_count = 1;
        this_00->_M_weak_count = 1;
        this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011e7a8;
        local_198 = this_00 + 1;
        this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__pdf_0011e7f8;
        *(hittable **)&this_00[1]._M_use_count = lights;
        this_00[3]._vptr__Sp_counted_base = local_88;
        this_00[2]._vptr__Sp_counted_base = local_98;
        *(double *)&this_00[2]._M_use_count = dStack_90;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = 2;
        }
        local_1b0 = plStack_140;
        local_1a8._M_pi = local_138;
        if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_138->_M_use_count = local_138->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_138->_M_use_count = local_138->_M_use_count + 1;
          }
        }
        local_1a0 = &PTR__mixture_pdf_0011e850;
        local_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        plStack_188 = (long *)0x0;
        local_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1f0._M_pi = this_00;
        local_1b8 = lights;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_190,&local_1f0);
        plStack_188 = local_1b0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_180,&local_1a8);
        if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
        }
        if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
        }
        iVar5 = rand();
        (*(&local_198)[(ulong)(0.5 <= (double)iVar5 * 4.656612873077393e-10) * 2]->
          _vptr__Sp_counted_base[3])(&local_1e8);
        local_d8.tm = r->tm;
        local_d8.orig.e[2] = (double)local_88;
        local_d8.orig.e[0] = (double)local_98;
        local_d8.orig.e[1] = dStack_90;
        local_d8.dir.e[0]._0_4_ = local_1e8.e[0]._0_4_;
        local_d8.dir.e[0]._4_4_ = local_1e8.e[0]._4_4_;
        local_d8.dir.e[1]._0_4_ = local_1e8.e[1]._0_4_;
        local_d8.dir.e[1]._4_4_ = local_1e8.e[1]._4_4_;
        local_d8.dir.e[2] = local_1e8.e[2];
        (*local_198->_vptr__Sp_counted_base[2])(local_198,&local_d8.dir);
        local_1c0 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        local_1c8 = (double)(**(code **)(*plStack_188 + 0x10))(plStack_188,&local_d8.dir);
        local_e8 = (double)(**(code **)(*local_68 + 0x20))(local_68,r,&local_98,&local_d8);
        ray_color(&local_1e8,this,&local_d8,depth + -1,world,local_1b8);
        dVar3 = 1.0 / (local_1c0 * 0.5 + local_1c8 * 0.5);
        dStack_170 = dVar3 * local_e8 * dStack_150 *
                             (double)CONCAT44(local_1e8.e[1]._4_4_,local_1e8.e[1]._0_4_) +
                     dStack_170;
        auVar2._8_4_ = SUB84(dStack_170,0);
        auVar2._0_8_ = dVar3 * local_e8 * local_158 *
                               (double)CONCAT44(local_1e8.e[0]._4_4_,local_1e8.e[0]._0_4_) +
                       local_178;
        auVar2._12_4_ = (int)((ulong)dStack_170 >> 0x20);
        *(undefined1 (*) [16])__return_storage_ptr__->e = auVar2;
        __return_storage_ptr__->e[2] = local_148 * local_e8 * local_1e8.e[2] * dVar3 + local_168;
        local_1a0 = &PTR__mixture_pdf_0011e850;
        lVar6 = 0x20;
        do {
          if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_1a0 + lVar6) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_1a0 + lVar6))
            ;
          }
          lVar6 = lVar6 + -0x10;
        } while (lVar6 != 0);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
      }
    }
    if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

color ray_color(const ray& r, int depth, const hittable& world, const hittable& lights)
    const {
        // If we've exceeded the ray bounce limit, no more light is gathered.
        if (depth <= 0)
            return color(0,0,0);

        hit_record rec;

        // If the ray hits nothing, return the background color.
        if (!world.hit(r, interval(0.001, infinity), rec))
            return background;

        scatter_record srec;
        color color_from_emission = rec.mat->emitted(r, rec, rec.u, rec.v, rec.p);

        if (!rec.mat->scatter(r, rec, srec))
            return color_from_emission;

        if (srec.skip_pdf) {
            return srec.attenuation * ray_color(srec.skip_pdf_ray, depth-1, world, lights);
        }

        auto light_ptr = make_shared<hittable_pdf>(lights, rec.p);
        mixture_pdf p(light_ptr, srec.pdf_ptr);

        ray scattered = ray(rec.p, p.generate(), r.time());
        auto pdf_value = p.value(scattered.direction());

        double scattering_pdf = rec.mat->scattering_pdf(r, rec, scattered);

        color sample_color = ray_color(scattered, depth-1, world, lights);
        color color_from_scatter =
            (srec.attenuation * scattering_pdf * sample_color) / pdf_value;

        return color_from_emission + color_from_scatter;
    }